

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ReadObjectTag(BCReaderState *s)

{
  JSValue JVar1;
  uint32_t uVar2;
  JSAtom v;
  JSContext *ctx;
  int iVar3;
  JSValue this_obj;
  JSValue JVar4;
  JSAtom atom;
  uint32_t prop_count;
  JSAtom local_54;
  JSContext *local_50;
  uint32_t local_44;
  JSValueUnion local_40;
  JSValueUnion local_38;
  
  local_50 = s->ctx;
  JVar4 = JS_NewObjectProtoClass(local_50,local_50->class_proto[1],1);
  this_obj.tag = JVar4.tag;
  JVar4.u = JVar4.u;
  iVar3 = BC_add_object_ref1(s,(JSObject *)JVar4.u.ptr);
  if ((iVar3 == 0) &&
     (iVar3 = bc_get_leb128(s,&local_44), ctx = local_50, uVar2 = local_44, iVar3 == 0)) {
    for (; uVar2 != 0; uVar2 = uVar2 - 1) {
      JVar1.tag = this_obj.tag;
      JVar1.u.ptr = JVar4.u.ptr;
      JVar4.tag = this_obj.tag;
      JVar4.u.ptr = JVar4.u.ptr;
      local_38 = JVar4.u;
      iVar3 = bc_get_atom(s,&local_54);
      if (iVar3 != 0) goto LAB_0013f02e;
      JVar4 = JS_ReadObjectRec(s);
      v = local_54;
      if ((int)JVar4.tag == 6) {
        JS_FreeAtom(local_50,local_54);
        JVar4 = JVar1;
        goto LAB_0013f02e;
      }
      this_obj.u.ptr = JVar4.u.ptr;
      iVar3 = JS_DefinePropertyValue(ctx,this_obj,local_54,JVar4,7);
      JS_FreeAtom(ctx,v);
      JVar4.u.ptr = local_38.ptr;
      if (iVar3 < 0) goto LAB_0013f02e;
      JVar4.u = local_38;
    }
  }
  else {
LAB_0013f02e:
    local_40 = JVar4.u;
    if ((0xfffffff4 < (uint)JVar4.tag) &&
       (iVar3 = *local_40.ptr, *(int *)local_40.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(local_50->rt,JVar4);
    }
    JVar4 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar4;
}

Assistant:

static JSValue JS_ReadObjectTag(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue obj;
    uint32_t prop_count, i;
    JSAtom atom;
    JSValue val;
    int ret;
    
    obj = JS_NewObject(ctx);
    if (BC_add_object_ref(s, obj))
        goto fail;
    if (bc_get_leb128(s, &prop_count))
        goto fail;
    for(i = 0; i < prop_count; i++) {
        if (bc_get_atom(s, &atom))
            goto fail;
#ifdef DUMP_READ_OBJECT
        bc_read_trace(s, "propname: "); print_atom(s->ctx, atom); printf("\n");
#endif
        val = JS_ReadObjectRec(s);
        if (JS_IsException(val)) {
            JS_FreeAtom(ctx, atom);
            goto fail;
        }
        ret = JS_DefinePropertyValue(ctx, obj, atom, val, JS_PROP_C_W_E);
        JS_FreeAtom(ctx, atom);
        if (ret < 0)
            goto fail;
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}